

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyIdSet.h
# Opt level: O2

void __thiscall Rml::PropertyIdSet::Insert(PropertyIdSet *this,PropertyId id)

{
  code *pcVar1;
  bool bVar2;
  
  if ((char)id < '\0') {
    bVar2 = Assert("RMLUI_ASSERT(size_t(id) < N)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/PropertyIdSet.h"
                   ,0x39);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  ::std::bitset<128UL>::set(&this->defined_ids,(ulong)id,true);
  return;
}

Assistant:

void Insert(PropertyId id)
	{
		RMLUI_ASSERT(size_t(id) < N);
		defined_ids.set((size_t)id);
	}